

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_palette.cpp
# Opt level: O0

void Cmd_bumpgamma(FCommandLine *argv,APlayerPawn *who,int key)

{
  float fVar1;
  float local_20;
  float newgamma;
  int key_local;
  APlayerPawn *who_local;
  FCommandLine *argv_local;
  
  local_20 = FFloatCVar::operator_cast_to_float(&Gamma);
  local_20 = local_20 + 0.1;
  if (3.0 < local_20) {
    local_20 = 1.0;
  }
  FFloatCVar::operator=(&Gamma,local_20);
  fVar1 = FFloatCVar::operator*(&Gamma);
  Printf("Gamma correction level %g\n",(double)fVar1);
  return;
}

Assistant:

CCMD (bumpgamma)
{
	// [RH] Gamma correction tables are now generated
	// on the fly for *any* gamma level.
	// Q: What are reasonable limits to use here?

	float newgamma = Gamma + 0.1f;

	if (newgamma > 3.0)
		newgamma = 1.0;

	Gamma = newgamma;
	Printf ("Gamma correction level %g\n", *Gamma);
}